

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signature.cpp
# Opt level: O0

uint __thiscall Kernel::Signature::getApp(Signature *this)

{
  initializer_list<Kernel::TermList> sorts;
  uint uVar1;
  TermList TVar2;
  long in_RDI;
  Symbol *sym;
  OperatorType *ot;
  TermList arrowType;
  TermList tv2;
  TermList tv1;
  uint app;
  bool added;
  bool *in_stack_000001f0;
  uint in_stack_000001fc;
  string *in_stack_00000200;
  Signature *in_stack_00000208;
  undefined4 in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  TermList in_stack_ffffffffffffff58;
  allocator<char> *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  TermList local_58;
  size_type local_50;
  allocator<char> local_31;
  string local_30 [32];
  uint local_10;
  byte local_9;
  
  local_9 = 0;
  TVar2._content = (uint64_t)&local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  uVar1 = addFunction(in_stack_00000208,in_stack_00000200,in_stack_000001fc,in_stack_000001f0);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  local_10 = uVar1;
  if ((local_9 & 1) != 0) {
    *(uint *)(in_RDI + 0x210) = uVar1;
    TermList::TermList((TermList *)CONCAT44(uVar1,in_stack_ffffffffffffff40),
                       in_stack_ffffffffffffff3c,SUB41((uint)in_stack_ffffffffffffff38 >> 0x18,0));
    TermList::TermList((TermList *)CONCAT44(uVar1,in_stack_ffffffffffffff40),
                       in_stack_ffffffffffffff3c,SUB41((uint)in_stack_ffffffffffffff38 >> 0x18,0));
    TVar2 = AtomicSort::arrowSort(in_stack_ffffffffffffff58,TVar2);
    sorts._M_len = local_50;
    sorts._M_array = (iterator)TVar2._content;
    OperatorType::getFunctionType(sorts,local_58,(uint)(in_stack_ffffffffffffff58._content >> 0x20))
    ;
    getFunction((Signature *)CONCAT44(uVar1,in_stack_ffffffffffffff40),in_stack_ffffffffffffff3c);
    Symbol::setType((Symbol *)CONCAT44(uVar1,in_stack_ffffffffffffff40),
                    (OperatorType *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  }
  return local_10;
}

Assistant:

unsigned Signature::getApp()
{
  bool added = false;
  unsigned app = addFunction("vAPP", 4, added);
  if(added){
    _appFun = app;
    TermList tv1 = TermList(0, false);
    TermList tv2 = TermList(1, false);
    TermList arrowType = AtomicSort::arrowSort(tv1, tv2);
    OperatorType* ot = OperatorType::getFunctionType({arrowType, tv1}, tv2, 2);
    Symbol* sym = getFunction(app);
    sym->setType(ot);
  }
  return app;
}